

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O1

double __thiscall internalJSONNode::operator_cast_to_double(internalJSONNode *this)

{
  uchar uVar1;
  internalJSONNode *this_00;
  json_number jVar2;
  double dVar3;
  json_string local_40;
  
  this_00 = this;
  Fetch(this);
  uVar1 = this->_type;
  if (uVar1 == '\0') {
LAB_0011834b:
    jVar2 = 0.0;
  }
  else {
    if (uVar1 == '\x01') {
      this_00 = (internalJSONNode *)(this->_string)._M_dataplus._M_p;
      dVar3 = atof((char *)this_00);
      (this->_value)._number = dVar3;
    }
    else if (uVar1 == '\x03') {
      if ((this->_value)._bool != false) {
        return 1.0;
      }
      goto LAB_0011834b;
    }
    if (jsonSingletonERROR_UNDEFINED::getValue[abi:cxx11]()::single == '\0') {
      operator_cast_to_double(this_00);
    }
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,jsonSingletonERROR_UNDEFINED::getValue[abi:cxx11]()::single,
               DAT_00126760 + jsonSingletonERROR_UNDEFINED::getValue[abi:cxx11]()::single);
    std::__cxx11::string::append((char *)&local_40);
    JSONDebug::_JSON_ASSERT(uVar1 == '\x02',&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    jVar2 = (this->_value)._number;
  }
  return jVar2;
}

Assistant:

internalJSONNode::operator double() const json_nothrow {
		  Fetch();
		  #ifdef JSON_CASTABLE /*-> JSON_CASTABLE */
			 switch(type()){
				case JSON_NULL:
				    return (double)0.0;
				case JSON_BOOL:
				    return (double)(_value._bool ? 1.0 : 0.0);
				case JSON_STRING:
				    FetchNumber();
			 }
		  #endif /*<- */
		  JSON_ASSERT(type() == JSON_NUMBER, json_global(ERROR_UNDEFINED) + JSON_TEXT("(double)"));
		  return (double)_value._number;
	   }